

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_61e64c::Marshal<MLKEM768_public_key>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          _func_int_CBB_ptr_MLKEM768_public_key_ptr *marshal_func,MLKEM768_public_key *t)

{
  int iVar1;
  allocator_type local_59;
  uint8_t *encoded;
  size_t encoded_len;
  ScopedCBB cbb;
  
  CBB_zero(&cbb.ctx_);
  iVar1 = CBB_init(&cbb.ctx_,1);
  if (iVar1 != 0) {
    iVar1 = MLKEM768_marshal_public_key(&cbb.ctx_,(MLKEM768_public_key *)marshal_func);
    if (iVar1 != 0) {
      iVar1 = CBB_finish(&cbb.ctx_,&encoded,&encoded_len);
      if (iVar1 != 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   encoded,encoded + encoded_len,&local_59);
        OPENSSL_free(encoded);
        bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb)
        ;
        return __return_storage_ptr__;
      }
    }
  }
  abort();
}

Assistant:

std::vector<uint8_t> Marshal(int (*marshal_func)(CBB *, const T *),
                             const T *t) {
  bssl::ScopedCBB cbb;
  uint8_t *encoded;
  size_t encoded_len;
  if (!CBB_init(cbb.get(), 1) ||      //
      !marshal_func(cbb.get(), t) ||  //
      !CBB_finish(cbb.get(), &encoded, &encoded_len)) {
    abort();
  }

  std::vector<uint8_t> ret(encoded, encoded + encoded_len);
  OPENSSL_free(encoded);
  return ret;
}